

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

string * __thiscall
iDynTree::KinDynComputations::getDescriptionOfDegreesOfFreedom_abi_cxx11_
          (string *__return_storage_ptr__,KinDynComputations *this)

{
  string *psVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar4 = 0;
  while( true ) {
    uVar2 = iDynTree::Model::getNrOfDOFs();
    psVar1 = local_1c0;
    if (uVar2 <= uVar4) break;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"DOF Index: ",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," Name: ",7);
    iDynTree::Model::getJointName_abi_cxx11_((long)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1e0,local_1d8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string KinDynComputations::getDescriptionOfDegreesOfFreedom() const
{
    std::stringstream ss;

    for(unsigned int dof = 0; dof < this->getNrOfDegreesOfFreedom(); dof++ )
    {
        ss << "DOF Index: " << dof << " Name: " <<  this->getDescriptionOfDegreeOfFreedom(dof) << std::endl;
    }

    return ss.str();
}